

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

QRect __thiscall QToolBarAreaLayoutInfo::itemRect(QToolBarAreaLayoutInfo *this,QList<int> *path)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  QToolBarAreaLayoutLine *pQVar4;
  QToolBarAreaLayoutItem *pQVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  QRect QVar12;
  
  piVar3 = (path->d).ptr;
  iVar1 = *piVar3;
  iVar2 = piVar3[1];
  pQVar4 = (this->lines).d.ptr;
  pQVar5 = pQVar4[iVar1].toolBarItems.d.ptr;
  uVar6._0_4_ = *(uint *)&pQVar4[iVar1].rect.x1;
  uVar6._4_4_ = pQVar4[iVar1].rect.y1;
  uVar9._0_4_ = pQVar4[iVar1].rect.x2;
  uVar9._4_4_ = pQVar4[iVar1].rect.y2;
  iVar10 = pQVar5[iVar2].size + -1;
  if (this->o == Horizontal) {
    uVar8 = uVar6 >> 0x20;
    uVar6._0_4_ = pQVar4[iVar1].rect.x1.m_i + pQVar5[iVar2].pos;
    uVar11 = (ulong)(iVar10 + (uint)uVar6);
    uVar9 = uVar9 & 0xffffffff00000000;
  }
  else {
    uVar7 = pQVar4[iVar1].rect.y1.m_i + pQVar5[iVar2].pos;
    uVar8 = (ulong)uVar7;
    uVar11 = (ulong)(iVar10 + uVar7) << 0x20;
    uVar9 = uVar9 & 0xffffffff;
  }
  QVar12._8_8_ = uVar9 | uVar11;
  QVar12._0_8_ = (ulong)(uint)uVar6 | uVar8 << 0x20;
  return QVar12;
}

Assistant:

const T *data() const noexcept { return ptr; }